

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O3

void __thiscall ConfigTest_read_object_Test::TestBody(ConfigTest_read_object_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
  *paVar1;
  char *pcVar2;
  path file_path;
  internal local_128 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_120;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_118;
  undefined1 local_f8 [48];
  __index_type local_c8;
  undefined1 *local_b8;
  undefined8 local_b0;
  undefined1 local_a8;
  undefined7 uStack_a7;
  undefined4 local_9f;
  undefined2 local_9b;
  char8_t local_99;
  undefined1 *local_98;
  undefined8 local_90;
  undefined1 local_88;
  undefined7 uStack_87;
  path local_78;
  path local_50;
  
  std::filesystem::__cxx11::path::path<char[17],std::filesystem::__cxx11::path>
            (&local_78,(char (*) [17])"read_object.test",auto_format);
  local_f8._0_8_ = local_f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"some_data","");
  make_tmp_file(&local_50,&local_78,(string *)local_f8);
  if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
  }
  std::filesystem::__cxx11::path::~path(&local_78);
  local_90 = 0;
  local_88 = 0;
  local_98 = &local_88;
  jessilib::config::read_object((path *)local_f8,(string *)&local_50,(text_encoding)&local_98);
  local_b0 = 0;
  local_a8 = 0;
  paVar1 = &local_118.field_2;
  local_118._M_dataplus._M_p = (pointer)paVar1;
  local_b8 = &local_a8;
  if (local_c8 == '\x04') {
    std::__cxx11::u8string::_M_construct<char8_t*>
              ((u8string *)&local_118,local_f8._0_8_,(pointer)(local_f8._8_8_ + local_f8._0_8_));
  }
  else {
    local_118.field_2._M_local_buf[0] = '\0';
    local_118.field_2._M_allocated_capacity._1_7_ = uStack_a7;
    local_118.field_2._9_4_ = local_9f;
    local_118.field_2._13_2_ = local_9b;
    local_118.field_2._M_local_buf[0xf] = local_99;
    local_118._M_string_length = 0;
    local_b0 = 0;
    local_a8 = 0;
  }
  testing::internal::CmpHelperEQ<std::__cxx11::u8string,char8_t[10]>
            (local_128,"config::read_object(file_path).get<std::u8string>()","u8\"some_data\"",
             &local_118,(char8_t (*) [10])"some_data");
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_118._M_dataplus._M_p != paVar1) {
    operator_delete(local_118._M_dataplus._M_p,
                    CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                             local_118.field_2._M_local_buf[0]) + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)local_f8);
  if (local_98 != &local_88) {
    operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
  }
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_f8);
    if (local_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_120->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/config.cpp"
               ,0x3a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_118,(Message *)local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_118);
    if ((void *)local_f8._0_8_ != (void *)0x0) {
      (**(code **)(*(long *)local_f8._0_8_ + 8))();
    }
  }
  if (local_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_120,local_120);
  }
  std::filesystem::__cxx11::path::~path(&local_50);
  return;
}

Assistant:

TEST(ConfigTest, read_object) {
	std::filesystem::path file_path = make_tmp_file("read_object.test", "some_data");
	EXPECT_EQ(config::read_object(file_path).get<std::u8string>(), u8"some_data");
}